

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

int __thiscall miniros::NodeHandle::shutdown(NodeHandle *this,int __fd,int __how)

{
  int iVar1;
  uint uVar2;
  pointer pwVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Impl *this_00;
  pointer pwVar5;
  Impl *this_01;
  pointer pwVar6;
  Impl *this_02;
  pointer pwVar7;
  Impl *this_03;
  _Atomic_word _Var8;
  uint uVar9;
  NodeHandleBackingCollection *pNVar10;
  NodeHandleBackingCollection *extraout_RAX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  pointer pwVar11;
  pointer pwVar12;
  pointer pwVar13;
  pointer pwVar14;
  bool bVar15;
  
  pNVar10 = this->collection_;
  pwVar11 = (pNVar10->subs_).
            super__Vector_base<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pwVar3 = (pNVar10->subs_).
           super__Vector_base<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pwVar11 != pwVar3) {
    do {
      p_Var4 = (pwVar11->super___weak_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var8 = p_Var4->_M_use_count;
        do {
          if (_Var8 == 0) goto LAB_001eb2da;
          LOCK();
          iVar1 = p_Var4->_M_use_count;
          bVar15 = _Var8 == iVar1;
          if (bVar15) {
            p_Var4->_M_use_count = _Var8 + 1;
            iVar1 = _Var8;
          }
          _Var8 = iVar1;
          UNLOCK();
        } while (!bVar15);
        if ((p_Var4->_M_use_count != 0) &&
           (this_00 = (pwVar11->
                      super___weak_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr, this_00 != (Impl *)0x0)) {
          Subscriber::Impl::unsubscribe(this_00);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        __how = extraout_EDX;
      }
LAB_001eb2da:
      pwVar11 = pwVar11 + 1;
    } while (pwVar11 != pwVar3);
    pNVar10 = this->collection_;
  }
  pwVar12 = (pNVar10->pubs_).
            super__Vector_base<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pwVar5 = (pNVar10->pubs_).
           super__Vector_base<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pwVar12 != pwVar5) {
    do {
      p_Var4 = (pwVar12->super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var8 = p_Var4->_M_use_count;
        do {
          if (_Var8 == 0) goto LAB_001eb32f;
          LOCK();
          iVar1 = p_Var4->_M_use_count;
          bVar15 = _Var8 == iVar1;
          if (bVar15) {
            p_Var4->_M_use_count = _Var8 + 1;
            iVar1 = _Var8;
          }
          _Var8 = iVar1;
          UNLOCK();
        } while (!bVar15);
        if ((p_Var4->_M_use_count != 0) &&
           (this_01 = (pwVar12->
                      super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           , this_01 != (Impl *)0x0)) {
          Publisher::Impl::unadvertise(this_01);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        __how = extraout_EDX_00;
      }
LAB_001eb32f:
      pwVar12 = pwVar12 + 1;
    } while (pwVar12 != pwVar5);
    pNVar10 = this->collection_;
  }
  pwVar13 = (pNVar10->srvs_).
            super__Vector_base<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pwVar6 = (pNVar10->srvs_).
           super__Vector_base<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pwVar13 != pwVar6) {
    do {
      p_Var4 = (pwVar13->super___weak_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var8 = p_Var4->_M_use_count;
        do {
          if (_Var8 == 0) goto LAB_001eb385;
          LOCK();
          iVar1 = p_Var4->_M_use_count;
          bVar15 = _Var8 == iVar1;
          if (bVar15) {
            p_Var4->_M_use_count = _Var8 + 1;
            iVar1 = _Var8;
          }
          _Var8 = iVar1;
          UNLOCK();
        } while (!bVar15);
        if ((p_Var4->_M_use_count != 0) &&
           (this_02 = (pwVar13->
                      super___weak_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr, this_02 != (Impl *)0x0)) {
          ServiceServer::Impl::unadvertise(this_02);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        __how = extraout_EDX_01;
      }
LAB_001eb385:
      pwVar13 = pwVar13 + 1;
    } while (pwVar13 != pwVar6);
    pNVar10 = this->collection_;
  }
  pwVar14 = (pNVar10->srv_cs_).
            super__Vector_base<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pwVar7 = (pNVar10->srv_cs_).
           super__Vector_base<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pwVar14 == pwVar7) {
      this->ok_ = false;
      return (int)pNVar10;
    }
    p_Var4 = (pwVar14->super___weak_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pNVar10 = (NodeHandleBackingCollection *)(ulong)(uint)p_Var4->_M_use_count;
      do {
        uVar9 = (uint)pNVar10;
        if (uVar9 == 0) goto LAB_001eb3db;
        LOCK();
        uVar2 = p_Var4->_M_use_count;
        if (uVar9 == uVar2) {
          p_Var4->_M_use_count = uVar9 + 1;
        }
        else {
          pNVar10 = (NodeHandleBackingCollection *)(ulong)uVar2;
        }
        UNLOCK();
      } while (uVar9 != uVar2);
      if ((p_Var4->_M_use_count != 0) &&
         (this_03 = (pwVar14->
                    super___weak_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr, this_03 != (Impl *)0x0)) {
        ServiceClient::Impl::shutdown(this_03,__fd,__how);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      pNVar10 = extraout_RAX;
      __how = extraout_EDX_02;
    }
LAB_001eb3db:
    pwVar14 = pwVar14 + 1;
  } while( true );
}

Assistant:

void NodeHandle::shutdown()
{
  {
    NodeHandleBackingCollection::V_SubImpl::iterator it = collection_->subs_.begin();
    NodeHandleBackingCollection::V_SubImpl::iterator end = collection_->subs_.end();
    for (; it != end; ++it)
    {
      Subscriber::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unsubscribe();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_PubImpl::iterator it = collection_->pubs_.begin();
    NodeHandleBackingCollection::V_PubImpl::iterator end = collection_->pubs_.end();
    for (; it != end; ++it)
    {
      Publisher::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvImpl::iterator it = collection_->srvs_.begin();
    NodeHandleBackingCollection::V_SrvImpl::iterator end = collection_->srvs_.end();
    for (; it != end; ++it)
    {
      ServiceServer::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvCImpl::iterator it = collection_->srv_cs_.begin();
    NodeHandleBackingCollection::V_SrvCImpl::iterator end = collection_->srv_cs_.end();
    for (; it != end; ++it)
    {
      ServiceClient::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->shutdown();
      }
    }
  }

  ok_ = false;
}